

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::to_trivial_mix_op
          (CompilerGLSL *this,SPIRType *type,string *op,uint32_t left,uint32_t right,uint32_t lerp)

{
  double dVar1;
  Variant *pVVar2;
  SPIRConstant *this_00;
  ulong uVar3;
  SPIRConstant *this_01;
  SPIRType *pSVar4;
  bool bVar5;
  float fVar6;
  string local_50;
  
  uVar3 = (ulong)left;
  if ((uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar2[uVar3].type == TypeConstant)) {
    this_00 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar3);
  }
  else {
    this_00 = (SPIRConstant *)0x0;
  }
  uVar3 = (ulong)right;
  if ((uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar2[uVar3].type == TypeConstant)) {
    this_01 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar3);
  }
  else {
    this_01 = (SPIRConstant *)0x0;
  }
  pSVar4 = Compiler::expression_type(&this->super_Compiler,lerp);
  if (this_00 == (SPIRConstant *)0x0) {
    return false;
  }
  if (this_01 == (SPIRConstant *)0x0) {
    return false;
  }
  if ((this_00->specialization != false) || (this_01->specialization != false)) {
    return false;
  }
  if (*(int *)&(pSVar4->super_IVariant).field_0xc != 2) {
    return false;
  }
  if (1 < pSVar4->vecsize) {
    return false;
  }
  bVar5 = false;
  switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
  case 5:
  case 6:
    if (*(short *)(this_00->m).c[0].r == 0) {
      bVar5 = *(short *)(this_01->m).c[0].r == 1;
      goto switchD_001c03c3_caseD_b;
    }
    break;
  case 7:
  case 8:
    if ((this_00->m).c[0].r[0].u32 == 0) {
      bVar5 = (this_01->m).c[0].r[0].u32 == 1;
      goto switchD_001c03c3_caseD_b;
    }
    break;
  case 9:
  case 10:
    if ((this_00->m).c[0].r[0].u64 == 0) {
      bVar5 = (this_01->m).c[0].r[0].u64 == 1;
      goto switchD_001c03c3_caseD_b;
    }
    break;
  default:
    goto switchD_001c03c3_caseD_b;
  case 0xc:
    bVar5 = false;
    fVar6 = SPIRConstant::scalar_f16(this_00,0,0);
    if ((fVar6 != 0.0) || (NAN(fVar6))) goto switchD_001c03c3_caseD_b;
    fVar6 = SPIRConstant::scalar_f16(this_01,0,0);
LAB_001c0450:
    bVar5 = fVar6 == 1.0;
LAB_001c047c:
    bVar5 = (bool)(-bVar5 & 1);
    goto switchD_001c03c3_caseD_b;
  case 0xd:
    fVar6 = (this_00->m).c[0].r[0].f32;
    if ((fVar6 == 0.0) && (!NAN(fVar6))) {
      fVar6 = (this_01->m).c[0].r[0].f32;
      goto LAB_001c0450;
    }
    break;
  case 0xe:
    dVar1 = (this_00->m).c[0].r[0].f64;
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      bVar5 = (this_01->m).c[0].r[0].f64 == 1.0;
      goto LAB_001c047c;
    }
  }
  bVar5 = false;
switchD_001c03c3_caseD_b:
  if (bVar5 != false) {
    type_to_glsl_constructor_abi_cxx11_(&local_50,this,type);
    ::std::__cxx11::string::operator=((string *)op,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return bVar5;
}

Assistant:

bool CompilerGLSL::to_trivial_mix_op(const SPIRType &type, string &op, uint32_t left, uint32_t right, uint32_t lerp)
{
	auto *cleft = maybe_get<SPIRConstant>(left);
	auto *cright = maybe_get<SPIRConstant>(right);
	auto &lerptype = expression_type(lerp);

	// If our targets aren't constants, we cannot use construction.
	if (!cleft || !cright)
		return false;

	// If our targets are spec constants, we cannot use construction.
	if (cleft->specialization || cright->specialization)
		return false;

	// We can only use trivial construction if we have a scalar
	// (should be possible to do it for vectors as well, but that is overkill for now).
	if (lerptype.basetype != SPIRType::Boolean || lerptype.vecsize > 1)
		return false;

	// If our bool selects between 0 and 1, we can cast from bool instead, making our trivial constructor.
	bool ret = false;
	switch (type.basetype)
	{
	case SPIRType::Short:
	case SPIRType::UShort:
		ret = cleft->scalar_u16() == 0 && cright->scalar_u16() == 1;
		break;

	case SPIRType::Int:
	case SPIRType::UInt:
		ret = cleft->scalar() == 0 && cright->scalar() == 1;
		break;

	case SPIRType::Half:
		ret = cleft->scalar_f16() == 0.0f && cright->scalar_f16() == 1.0f;
		break;

	case SPIRType::Float:
		ret = cleft->scalar_f32() == 0.0f && cright->scalar_f32() == 1.0f;
		break;

	case SPIRType::Double:
		ret = cleft->scalar_f64() == 0.0 && cright->scalar_f64() == 1.0;
		break;

	case SPIRType::Int64:
	case SPIRType::UInt64:
		ret = cleft->scalar_u64() == 0 && cright->scalar_u64() == 1;
		break;

	default:
		break;
	}

	if (ret)
		op = type_to_glsl_constructor(type);
	return ret;
}